

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_allocators.h
# Opt level: O2

void * __thiscall
density_tests::DeepTestAllocator<256UL>::try_allocate_page
          (DeepTestAllocator<256UL> *this,progress_guarantee i_progress_guarantee)

{
  bool bVar1;
  void *i_block;
  
  bVar1 = ThreadAllocRandomFailures::should_fail();
  if ((!bVar1) &&
     (i_block = density::basic_default_allocator<256UL>::try_allocate_page
                          ((basic_default_allocator<256UL> *)this,i_progress_guarantee),
     i_block != (void *)0x0)) {
    SharedBlockRegistry::register_block(&this->m_registry,4,i_block,0xf0,0x100,0);
    DeepTestAllocator<256ul>::invoke_hook<void*>((DeepTestAllocator<256ul> *)this,1,(void *)0x0);
    return i_block;
  }
  return (void *)0x0;
}

Assistant:

void * try_allocate_page(density::progress_guarantee i_progress_guarantee)
        {
            if (ThreadAllocRandomFailures::should_fail())
                return nullptr;

            auto page = Base::try_allocate_page(i_progress_guarantee);
            if (page != nullptr)
            {
                m_registry.register_block(s_page_category, page, page_size, page_alignment, 0);
                invoke_hook(&IAllocatorHook::on_allocated_page, page);
            }
            return page;
        }